

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounddecoder.c
# Opt level: O2

void freeSoundDecoder(void)

{
  if (pa_dev != (pa_simple *)0x0) {
    pulseaudio_cleanup(pa_dev);
    pa_dev = (pa_simple *)0x0;
  }
  if (pcm != (snd_pcm_t *)0x0) {
    input_cleanup(pcm);
    pcm = (snd_pcm_t *)0x0;
  }
  if (fp != (FILE *)0x0) {
    fclose((FILE *)fp);
    fp = (FILE *)0x0;
  }
  if (rx_a != (receiver *)0x0) {
    free_receiver(rx_a);
    rx_a = (receiver *)0x0;
  }
  if (rx_b != (receiver *)0x0) {
    free_receiver(rx_b);
    rx_b = (receiver *)0x0;
  }
  if (buffer != (short *)0x0) {
    hfree(buffer);
    buffer = (short *)0x0;
  }
  return;
}

Assistant:

void freeSoundDecoder() {
#ifdef HAVE_PULSEAUDIO
    if (pa_dev) {
        pulseaudio_cleanup(pa_dev);
        pa_dev=NULL;
    }
#endif

#ifdef HAVE_ALSA
    if (pcm != NULL) {
        input_cleanup(pcm);
        pcm = NULL;
    }
#endif
#ifdef WIN32
    if (winmm_device) {
        winmm_cleanup(&winmm_device, &winmm_event);
    }
#endif
    if (fp != NULL) {
        fclose(fp);
        fp=NULL;
    }

    if (rx_a != NULL) {
        free_receiver(rx_a);
        rx_a=NULL;
    }

    if (rx_b != NULL) {
        free_receiver(rx_b);
        rx_b=NULL;
    }

    if (buffer != NULL) {
        hfree(buffer);
        buffer = NULL;
    }
}